

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::isExtensionSupported
               (Context *context,string *extensionName)

{
  bool bVar1;
  RenderContext *pRVar2;
  ContextInfo *pCVar3;
  char *pcVar4;
  NotSupportedError *pNVar5;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_ba;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  deUint32 local_20;
  ContextType local_1c;
  string *local_18;
  string *extensionName_local;
  Context *context_local;
  
  local_18 = extensionName;
  extensionName_local = (string *)context;
  bVar1 = std::operator==(extensionName,"GL_EXT_draw_buffers_indexed");
  if ((bVar1) || (bVar1 = std::operator==(extensionName,"GL_KHR_blend_equation_advanced"), bVar1)) {
    pRVar2 = Context::getRenderContext((Context *)extensionName_local);
    local_1c.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
    local_20 = (deUint32)glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(local_1c,(ApiType)local_20);
    if (!bVar1) {
      pCVar3 = Context::getContextInfo((Context *)extensionName_local);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,pcVar4);
      if (!bVar1) {
        local_ba = 1;
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Extension ",&local_81);
        std::operator+(&local_60,&local_80,extensionName);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8," not supported.",&local_b9);
        std::operator+(&local_40,&local_60,&local_b8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        tcu::NotSupportedError::NotSupportedError
                  (pNVar5,pcVar4,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                   ,0x47);
        local_ba = 0;
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
  }
  else {
    pCVar3 = Context::getContextInfo((Context *)extensionName_local);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,pcVar4);
    if (!bVar1) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"Extension ",&local_121);
      std::operator+(&local_100,&local_120,extensionName);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148," not supported.",&local_149);
      std::operator+(&local_e0,&local_100,&local_148);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      tcu::NotSupportedError::NotSupportedError
                (pNVar5,pcVar4,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                 ,0x4a);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return;
}

Assistant:

void isExtensionSupported (Context& context, std::string extensionName)
{
	if (extensionName == "GL_EXT_draw_buffers_indexed" || extensionName == "GL_KHR_blend_equation_advanced")
	{
		if (!contextSupports(context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !context.getContextInfo().isExtensionSupported(extensionName.c_str()))
			TCU_THROW(NotSupportedError, (std::string("Extension ") + extensionName + std::string(" not supported.")).c_str());
	}
	else if (!context.getContextInfo().isExtensionSupported(extensionName.c_str()))
		TCU_THROW(NotSupportedError, (std::string("Extension ") + extensionName + std::string(" not supported.")).c_str());
}